

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

void libtorrent::run_all_updates(session_impl *ses)

{
  code *pcVar1;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    pcVar1 = *(code **)(&aux::session_impl::init_peer_class_filter(bool)::v6_classes + lVar2);
    if (pcVar1 != (code *)0x0) {
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(ses->super_session_interface).
                                                      super_session_logger._vptr_session_logger +
                                              *(long *)((long)&(anonymous_namespace)::str_settings +
                                                       lVar2)) + -1);
      }
      (*pcVar1)();
    }
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x2e8);
  lVar2 = 0x10;
  do {
    pcVar1 = *(code **)((long)&PTR_typeinfo_004e52a8 + lVar2);
    if (pcVar1 != (code *)0x0) {
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(ses->super_session_interface).
                                                      super_session_logger._vptr_session_logger +
                                              *(long *)((long)&(anonymous_namespace)::int_settings +
                                                       lVar2)) + -1);
      }
      (*pcVar1)();
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x13f0);
  lVar2 = 8;
  do {
    pcVar1 = *(code **)((long)&(anonymous_namespace)::bool_settings + lVar2);
    if (pcVar1 != (code *)0x0) {
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + (long)(ses->super_session_interface).super_session_logger.
                                           _vptr_session_logger + -1);
      }
      (*pcVar1)(ses);
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xa88);
  return;
}

Assistant:

void run_all_updates(aux::session_impl& ses)
	{
		using fun_t = void (aux::session_impl::*)();
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			fun_t const& f = str_settings[i].fun;
			if (f) (ses.*f)();
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			fun_t const& f = int_settings[i].fun;
			if (f) (ses.*f)();
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			fun_t const& f = bool_settings[i].fun;
			if (f) (ses.*f)();
		}
	}